

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::ConfigBlockSymbol::checkUnusedRules(ConfigBlockSymbol *this)

{
  bool bVar1;
  type *ptVar2;
  Scope *scope;
  ConfigBlockSymbol *in_RDI;
  const_iterator cVar3;
  type *instOverride;
  type *__1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  flat_hash_map<std::string_view,_InstanceOverride>_conflict *__range2_1;
  type *rule;
  type *lib;
  const_iterator __end3;
  const_iterator __begin3;
  flat_hash_map<const_SourceLibrary_*,_ConfigRule_*> *__range3;
  type *cellOverride;
  type *_;
  const_iterator __end2;
  const_iterator __begin2;
  flat_hash_map<std::string_view,_CellOverride> *__range2;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff40;
  ConfigRule *in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff50 [16];
  
  getCellOverrides(in_RDI);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
  ::begin((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
           *)0x8abb86);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
  ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
         *)0x8abba3);
  while( true ) {
    bVar1 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_RDI,
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_ffffffffffffff28);
    if (!bVar1) break;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 *)in_RDI);
    std::
    get<0ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>
              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>
                *)0x8abbf3);
    ptVar2 = std::
             get<1ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>
                       ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>
                         *)0x8abc08);
    if (ptVar2->defaultRule != (ConfigRule *)0x0) {
      checkRuleUnused(in_stack_ffffffffffffff50._0_8_,in_stack_ffffffffffffff48,
                      SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
    }
    boost::unordered::
    unordered_flat_map<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
    ::begin((unordered_flat_map<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
             *)0x8abc5b);
    boost::unordered::
    unordered_flat_map<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
    ::end((unordered_flat_map<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
           *)0x8abc75);
    while( true ) {
      bVar1 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_RDI,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_ffffffffffffff28);
      if (!bVar1) break;
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                   *)in_RDI);
      std::get<0ul,slang::SourceLibrary_const*const,slang::ast::ConfigRule*>
                ((pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*> *)0x8abcad);
      std::get<1ul,slang::SourceLibrary_const*const,slang::ast::ConfigRule*>
                ((pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*> *)0x8abcbc);
      checkRuleUnused(in_stack_ffffffffffffff50._0_8_,in_stack_ffffffffffffff48,
                      SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                    *)in_RDI);
    }
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                  *)in_RDI);
  }
  scope = (Scope *)getInstanceOverrides(in_RDI);
  cVar3 = boost::unordered::
          unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
          ::begin((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                   *)0x8abd15);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
  ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
         *)0x8abd29);
  while( true ) {
    bVar1 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_RDI,in_stack_ffffffffffffff28);
    if (!bVar1) break;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 *)in_RDI);
    std::
    get<0ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>
              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                *)0x8abd61);
    std::
    get<1ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>
              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                *)0x8abd70);
    checkNodeUnused(scope,(InstanceOverride *)cVar3.p_);
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                  *)in_RDI);
  }
  return;
}

Assistant:

void ConfigBlockSymbol::checkUnusedRules() const {
    for (auto& [_, cellOverride] : getCellOverrides()) {
        if (cellOverride.defaultRule)
            checkRuleUnused(*this, *cellOverride.defaultRule, true);

        for (auto& [lib, rule] : cellOverride.specificLibRules)
            checkRuleUnused(*this, *rule, true);
    }

    for (auto& [_, instOverride] : getInstanceOverrides())
        checkNodeUnused(*this, instOverride);
}